

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar1 = *(ulong *)((long)ff.internal + 0x40);
  if ((n < uVar1) && (*(ulong *)((long)ff.internal + 0x88) < uVar1)) {
    *(ulong *)((long)ff.internal + 0x88) = *(ulong *)((long)ff.internal + 0x88) + n;
  }
  else {
    *(ulong *)((long)ff.internal + 0x88) = uVar1;
  }
  if (uVar1 < *(ulong *)((long)ff.internal + 0x88)) {
    *(ulong *)((long)ff.internal + 0x88) = uVar1;
  }
  uVar2 = *(ulong *)((long)ff.internal + 0x88);
  if (n != 0 && uVar2 < uVar1) {
    if (*(long *)((long)ff.internal + 8) == 0) {
      iVar3 = fseek(*ff.internal,*(uint *)((long)ff.internal + 0x78) * n,1);
      bVar6 = iVar3 == 0;
    }
    else {
      lVar5 = *(uint *)((long)ff.internal + 0x78) * uVar2 + *(long *)((long)ff.internal + 0x80);
      lVar4 = gzseek64(*(long *)((long)ff.internal + 8),lVar5,0);
      bVar6 = lVar4 == lVar5;
    }
    if (!bVar6) {
      (*mcpl_error_handler)("Errors encountered while skipping in particle list");
      printf("MCPL ERROR: %s\n",
             "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
            );
      exit(1);
    }
  }
  return (int)(uVar2 < uVar1);
}

Assistant:

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)
{
  MCPLIMP_FILEDECODE;
  //increment, but guard against overflows:
  if ( n >= f->nparticles || f->current_particle_idx >= f->nparticles )
    f->current_particle_idx = f->nparticles;
  else
    f->current_particle_idx += n;
  if ( f->current_particle_idx > f->nparticles )
    f->current_particle_idx = f->nparticles;

  int notEOF = f->current_particle_idx<f->nparticles;
  if (n==0)
    return notEOF;
  if (notEOF) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek(f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK_CUR( f->file, f->particle_size * n )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while skipping in particle list");
  }
  return notEOF;
}